

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderPassMultiviewCreateInfo *create_info,ScratchAllocator *alloc)

{
  VkRenderPassMultiviewCreateInfo *pVVar1;
  uint *puVar2;
  int *piVar3;
  VkRenderPassMultiviewCreateInfo *info;
  ScratchAllocator *alloc_local;
  VkRenderPassMultiviewCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkRenderPassMultiviewCreateInfo>(this,create_info,1,alloc);
  if (pVVar1->pViewMasks != (uint32_t *)0x0) {
    puVar2 = copy<unsigned_int>(this,create_info->pViewMasks,(ulong)create_info->subpassCount,alloc)
    ;
    pVVar1->pViewMasks = puVar2;
  }
  if (pVVar1->pViewOffsets != (int32_t *)0x0) {
    piVar3 = copy<int>(this,create_info->pViewOffsets,(ulong)create_info->dependencyCount,alloc);
    pVVar1->pViewOffsets = piVar3;
  }
  if (pVVar1->pCorrelationMasks != (uint32_t *)0x0) {
    puVar2 = copy<unsigned_int>(this,create_info->pCorrelationMasks,
                                (ulong)create_info->correlationMaskCount,alloc);
    pVVar1->pCorrelationMasks = puVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(
		const VkRenderPassMultiviewCreateInfo *create_info,
		ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pViewMasks)
		info->pViewMasks = copy(create_info->pViewMasks, create_info->subpassCount, alloc);
	if (info->pViewOffsets)
		info->pViewOffsets = copy(create_info->pViewOffsets, create_info->dependencyCount, alloc);
	if (info->pCorrelationMasks)
		info->pCorrelationMasks = copy(create_info->pCorrelationMasks, create_info->correlationMaskCount, alloc);

	return info;
}